

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::RALocalAllocator::allocJumpTable
          (RALocalAllocator *this,InstNode *node,RABlocks *targets,RABlock *cont)

{
  uint *puVar1;
  RABlock *block;
  long lVar2;
  int *piVar3;
  int *piVar4;
  byte bVar5;
  Error EVar6;
  RABlock *pRVar7;
  undefined8 extraout_RAX;
  uint uVar8;
  ulong uVar9;
  size_t siglen;
  uint uVar10;
  uint extraout_EDX;
  uchar *sig;
  ulong uVar11;
  RALocalAllocator *this_00;
  uchar *in_R8;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  
  if (*(int *)(targets + 8) == 0) {
    return 3;
  }
  this_00 = *(RALocalAllocator **)node;
  (this->_cc->super_BaseBuilder)._cursor = (BaseNode *)this_00;
  block = (RABlock *)**(undefined8 **)targets;
  uVar8 = *(uint *)(block + 0xb8);
  uVar9 = 0xffffffff;
  if ((ulong)uVar8 == 0xffffffff) {
    return 3;
  }
  if (uVar8 < *(uint *)&this->_pass->field_0xf0) {
    lVar14 = (ulong)uVar8 * 0x20 + *(long *)&this->_pass->_sharedAssignments;
    this_00 = this;
    EVar6 = allocInst(this,node);
    if (EVar6 != 0) {
      return EVar6;
    }
    node = *(InstNode **)(lVar14 + 0x18);
    if ((PhysToWorkMap *)node != (PhysToWorkMap *)0x0) {
      in_R8 = (uchar *)0x0;
      this_00 = this;
      EVar6 = switchToAssignment(this,(PhysToWorkMap *)node,(ZoneBitVector *)(lVar14 + 8),true,false
                                );
      if (EVar6 != 0) {
        return EVar6;
      }
    }
    uVar8 = *(uint *)(block + 0xb8);
    if ((ulong)uVar8 == 0xffffffff) {
      pRVar7 = block + 0xbc;
LAB_00123d88:
      EVar6 = spillScratchGpRegsBeforeEntry(this,*(RegMask *)pRVar7);
      if ((EVar6 == 0) &&
         ((*(long *)(lVar14 + 0x18) != 0 ||
          (EVar6 = BaseRAPass::setBlockEntryAssignment
                             (this->_pass,block,this->_block,&this->_curAssignment), EVar6 == 0))))
      {
        EVar6 = 0;
      }
      return EVar6;
    }
    uVar9 = *(ulong *)block;
    if (uVar8 < *(uint *)(uVar9 + 0xf0)) {
      pRVar7 = (RABlock *)((ulong)uVar8 * 0x20 + *(long *)(uVar9 + 0xe8));
      goto LAB_00123d88;
    }
  }
  else {
    allocJumpTable();
  }
  allocJumpTable();
  uVar8 = (uint)uVar9;
  uVar10 = (uint)sig;
  if (uVar10 == 0xffffffff) {
    RAAssignment::assign();
LAB_00123e55:
    RAAssignment::assign();
LAB_00123e5a:
    RAAssignment::assign();
LAB_00123e5f:
    RAAssignment::assign();
LAB_00123e64:
    RAAssignment::assign();
LAB_00123e69:
    RAAssignment::assign();
LAB_00123e6e:
    RAAssignment::assign();
  }
  else {
    if (*(uint *)((long)&this_00->_cc + 4) <= uVar10) goto LAB_00123e55;
    lVar14 = *(long *)(this_00->_availableRegs)._masks._data;
    uVar12 = (ulong)sig & 0xffffffff;
    if (*(char *)(lVar14 + uVar12) != -1) goto LAB_00123e5a;
    if (0x1f < uVar8) goto LAB_00123e5f;
    if (3 < (byte)node) goto LAB_00123e64;
    node = (InstNode *)((ulong)node & 0xff);
    if (*(int *)(*(long *)((this_00->_clobberedRegs)._masks._data + (long)node * 2) +
                (uVar9 & 0xffffffff) * 4) != -1) goto LAB_00123e69;
    lVar2 = *(long *)((this_00->_availableRegs)._masks._data + 2);
    uVar13 = 1 << ((byte)uVar9 & 0x1f);
    if ((*(uint *)(lVar2 + (long)node * 4) >> (uVar8 & 0x1f) & 1) != 0) goto LAB_00123e6e;
    if ((*(uint *)(lVar2 + 0x10 + (long)node * 4) & uVar13) == 0) {
      *(byte *)(lVar14 + uVar12) = (byte)uVar9;
      *(uint *)(*(long *)((this_00->_clobberedRegs)._masks._data + (long)node * 2) +
               (uVar9 & 0xffffffff) * 4) = uVar10;
      lVar14 = *(long *)((this_00->_availableRegs)._masks._data + 2);
      puVar1 = (uint *)(lVar14 + (long)node * 4);
      *puVar1 = *puVar1 | uVar13;
      siglen = 0;
      if ((char)in_R8 != '\0') {
        siglen = (size_t)uVar13;
      }
      puVar1 = (uint *)(lVar14 + 0x10 + (long)node * 4);
      *puVar1 = *puVar1 | (uint)siglen;
      EVar6 = RAAssignment::verify
                        ((RAAssignment *)this_00,(EVP_PKEY_CTX *)node,sig,siglen,in_R8,uVar12);
      return EVar6;
    }
  }
  RAAssignment::assign();
  if (extraout_EDX == 0xffffffff) {
    onSaveReg();
LAB_00123ed6:
    onSaveReg();
LAB_00123edb:
    onSaveReg();
LAB_00123ee0:
    onSaveReg();
  }
  else {
    if ((this_00->_curAssignment)._layout.workCount <= extraout_EDX) goto LAB_00123ed6;
    if ((this_00->_curAssignment)._workToPhysMap[extraout_EDX].physIds[0] != uVar8)
    goto LAB_00123edb;
    if (0x1f < uVar8) goto LAB_00123ee0;
    if ((byte)node < 4) {
      uVar9 = (ulong)node & 0xff;
      node = (InstNode *)(this_00->_curAssignment)._physToWorkIds._data[uVar9];
      if ((((PhysToWorkMap *)node)->assigned)._masks._data[uVar8] == extraout_EDX) {
        bVar5 = (byte)uVar8 & 0x1f;
        puVar1 = (((this_00->_curAssignment)._physToWorkMap)->dirty)._masks._data + uVar9;
        *puVar1 = *puVar1 & (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5);
        EVar6 = (*(this_00->_pass->super_FuncPass).super_Pass._vptr_Pass[0xc])
                          (this_00->_pass,(ulong)extraout_EDX,(ulong)uVar8,extraout_RAX);
        return EVar6;
      }
      goto LAB_00123eea;
    }
  }
  onSaveReg();
LAB_00123eea:
  onSaveReg();
  if ((((*(uint *)&this_00->_pass == (((PhysToWorkMap *)node)->assigned)._masks._data[0]) &&
       (*(uint *)((long)&this_00->_pass + 4) == (((PhysToWorkMap *)node)->assigned)._masks._data[1])
       ) && (uVar8 = *(uint *)&this_00->_cc,
            uVar8 == (((PhysToWorkMap *)node)->assigned)._masks._data[2])) &&
     ((uVar10 = *(uint *)((long)&this_00->_cc + 4),
      uVar10 == (((PhysToWorkMap *)node)->assigned)._masks._data[3] &&
      (this_00->_archTraits == *(ArchTraits **)(((PhysToWorkMap *)node)->dirty)._masks._data)))) {
    if ((ulong)uVar8 != 0) {
      uVar9 = 0;
      do {
        if (*(int *)(*(long *)((this_00->_availableRegs)._masks._data + 2) + 0x20 + uVar9 * 4) !=
            *(int *)(*(long *)((PhysToWorkMap *)node)->workIds + 0x20 + uVar9 * 4)) {
          return 0;
        }
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
    if ((ulong)uVar10 != 0) {
      uVar9 = 0;
      do {
        if (*(char *)(*(long *)(this_00->_availableRegs)._masks._data + uVar9) !=
            *(char *)(*(long *)((((PhysToWorkMap *)node)->dirty)._masks._data + 2) + uVar9)) {
          return 0;
        }
        uVar9 = uVar9 + 1;
      } while (uVar10 != uVar9);
    }
    piVar3 = *(int **)((this_00->_availableRegs)._masks._data + 2);
    piVar4 = *(int **)((PhysToWorkMap *)node)->workIds;
    if (*piVar3 == *piVar4) {
      uVar9 = 0xffffffffffffffff;
      do {
        if (uVar9 == 2) goto LAB_00123f93;
        lVar14 = uVar9 + 2;
        uVar12 = uVar9 + 1;
        lVar2 = uVar9 + 2;
        uVar9 = uVar12;
      } while (piVar3[lVar14] == piVar4[lVar2]);
      if (2 < uVar12) {
LAB_00123f93:
        uVar9 = (ulong)(uint)piVar3[4];
        if (piVar3[4] == piVar4[4]) {
          uVar12 = 0;
          do {
            uVar11 = uVar12;
            uVar9 = CONCAT71((int7)(uVar9 >> 8),1);
            if (uVar11 == 3) {
              return (Error)uVar9;
            }
            uVar12 = uVar11 + 1;
          } while (piVar3[uVar11 + 5] == piVar4[uVar11 + 5]);
          if (2 < uVar11) {
            return (Error)uVar9;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

Error RALocalAllocator::allocJumpTable(InstNode* node, const RABlocks& targets, RABlock* cont) noexcept {
  // TODO: Do we really need to use `cont`?
  DebugUtils::unused(cont);

  if (targets.empty())
    return DebugUtils::errored(kErrorInvalidState);

  // The cursor must point to the previous instruction for a possible instruction insertion.
  _cc->_setCursor(node->prev());

  // All `targets` should have the same sharedAssignmentId, we just read the first.
  RABlock* anyTarget = targets[0];
  if (!anyTarget->hasSharedAssignmentId())
    return DebugUtils::errored(kErrorInvalidState);

  RASharedAssignment& sharedAssignment = _pass->_sharedAssignments[anyTarget->sharedAssignmentId()];

  ASMJIT_PROPAGATE(allocInst(node));

  if (!sharedAssignment.empty()) {
    ASMJIT_PROPAGATE(switchToAssignment(
      sharedAssignment.physToWorkMap(),
      sharedAssignment.liveIn(),
      true,  // Read-only.
      false  // Try-mode.
    ));
  }

  ASMJIT_PROPAGATE(spillRegsBeforeEntry(anyTarget));

  if (sharedAssignment.empty()) {
    ASMJIT_PROPAGATE(_pass->setBlockEntryAssignment(anyTarget, block(), _curAssignment));
  }

  return kErrorOk;
}